

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O1

void appendAtomRec(transformData *xform,char *rec,abrMkAtomProc *mkAtom,void *atomstuff)

{
  xformAtomRecords *pxVar1;
  
  if (rec != (char *)0x0 && xform != (transformData *)0x0) {
    pxVar1 = newXformAtomRecord(rec,mkAtom,atomstuff);
    if (pxVar1 != (xformAtomRecords *)0x0) {
      if (xform->recs == (xformAtomRecords *)0x0) {
        xform->recs = pxVar1;
        xform->lastrec = (xformAtomRecords *)0x0;
      }
      if (xform->lastrec != (xformAtomRecords *)0x0) {
        xform->lastrec->next = pxVar1;
      }
      xform->lastrec = pxVar1;
    }
  }
  return;
}

Assistant:

void appendAtomRec(transformData* xform, char* rec, abrMkAtomProc mkAtom, void *atomstuff) {
   xformAtomRecords * xr = NULL;

   if (xform && rec) {
      xr = newXformAtomRecord(rec, mkAtom, atomstuff);

      if (xr) {
	 if (xform->recs == NULL) {
	    xform->recs    = xr;
	    xform->lastrec = NULL;
	 }
	 if (xform->lastrec != NULL) {
	    xform->lastrec->next = xr;
	 }
	 xform->lastrec = xr;
      }
   }
}